

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_unpack(lua_State *L)

{
  cTValue *pcVar1;
  uint key;
  MSize MVar2;
  int iVar3;
  GCtab *t;
  cTValue *pcVar4;
  cTValue cVar5;
  int size;
  long lVar6;
  
  t = lj_lib_checktab(L,1);
  key = lj_lib_optint(L,2,1);
  if ((L->base + 2 < L->top) && (L->base[2].u64 != 0xffffffffffffffff)) {
    MVar2 = lj_lib_checkint(L,3);
  }
  else {
    MVar2 = lj_tab_len(t);
  }
  if ((int)key <= (int)MVar2) {
    if (MVar2 - key < 8000) {
      size = (MVar2 - key) + 1;
      iVar3 = lua_checkstack(L,size);
      if (iVar3 != 0) {
        lVar6 = (long)(int)key << 3;
        do {
          if (key < t->asize) {
            pcVar4 = (cTValue *)((t->array).ptr64 + lVar6);
          }
          else {
            pcVar4 = lj_tab_getinth(t,key);
          }
          pcVar1 = L->top;
          L->top = pcVar1 + 1;
          if (pcVar4 == (cTValue *)0x0) {
            cVar5.u64 = 0xffffffffffffffff;
          }
          else {
            cVar5 = *pcVar4;
          }
          *pcVar1 = cVar5;
          key = key + 1;
          lVar6 = lVar6 + 8;
        } while (MVar2 + 1 != key);
        return size;
      }
    }
    lj_err_caller(L,LJ_ERR_UNPACK);
  }
  return 0;
}

Assistant:

LJLIB_CF(unpack)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = lj_lib_optint(L, 2, 1);
  int32_t e = (L->base+3-1 < L->top && !tvisnil(L->base+3-1)) ?
	      lj_lib_checkint(L, 3) : (int32_t)lj_tab_len(t);
  uint32_t nu;
  if (i > e) return 0;
  nu = (uint32_t)e - (uint32_t)i;
  n = (int32_t)(nu+1);
  if (nu >= LUAI_MAXCSTACK || !lua_checkstack(L, n))
    lj_err_caller(L, LJ_ERR_UNPACK);
  do {
    cTValue *tv = lj_tab_getint(t, i);
    if (tv) {
      copyTV(L, L->top++, tv);
    } else {
      setnilV(L->top++);
    }
  } while (i++ < e);
  return n;
}